

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_address.c
# Opt level: O0

char * cmime_address_to_string(CMimeAddress_T *ca)

{
  char *local_18;
  char *s;
  CMimeAddress_T *ca_local;
  
  local_18 = (char *)0x0;
  s = (char *)ca;
  if (ca == (CMimeAddress_T *)0x0) {
    __assert_fail("ca",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_address.c"
                  ,0x41,"char *cmime_address_to_string(CMimeAddress_T *)");
  }
  if (ca->name == (char *)0x0) {
    asprintf(&local_18,"%s",ca->email);
  }
  else if (ca->parsed == 1) {
    asprintf(&local_18,"%s%s",ca->name,ca->email);
  }
  else {
    asprintf(&local_18,"%s %s",ca->name,ca->email);
  }
  return local_18;
}

Assistant:

char *cmime_address_to_string(CMimeAddress_T *ca) {
    char *s = NULL;
    
    assert(ca);
    if(ca->name != NULL) {
        if (ca->parsed==1) 
            asprintf(&s,"%s%s",ca->name,ca->email);
        else
            asprintf(&s,"%s %s",ca->name,ca->email);
    } else {
        asprintf(&s,"%s",ca->email);
    }
    
    return(s);
}